

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font.cxx
# Opt level: O0

void fl_text_extents(char *c,int *dx,int *dy,int *w,int *h)

{
  size_t sVar1;
  int *h_local;
  int *w_local;
  int *dy_local;
  int *dx_local;
  char *c_local;
  
  if (c == (char *)0x0) {
    *w = 0;
    *h = 0;
    *dx = 0;
    *dy = 0;
  }
  else {
    sVar1 = strlen(c);
    fl_text_extents(c,(int)sVar1,dx,dy,w,h);
  }
  return;
}

Assistant:

void fl_text_extents(const char *c, int &dx, int &dy, int &w, int &h) {
  if (c)  fl_text_extents(c, (int) strlen(c), dx, dy, w, h);
  else {
    w = 0; h = 0;
    dx = 0; dy = 0;
  }
}